

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O2

void __thiscall Am_Point_List::~Am_Point_List(Am_Point_List *this)

{
  Am_Point_List_Data *this_00;
  
  this_00 = this->data;
  if (this_00 != (Am_Point_List_Data *)0x0) {
    if ((this_00->super_Am_Wrapper).refs == 0) {
      Am_Error();
    }
    Am_Wrapper::Release(&this_00->super_Am_Wrapper);
  }
  this->data = (Am_Point_List_Data *)0x0;
  this->item = (Am_Point_Item *)0x0;
  return;
}

Assistant:

Am_Point_List::~Am_Point_List()
{
  if (data) {
    if (data->Is_Zero())
      Am_Error();
    data->Release();
  }
  data = nullptr;
  item = nullptr;
}